

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# acbPush.c
# Opt level: O3

void Acb_ObjPushToFanin(Acb_Ntk_t *p,int iObj,int iFaninIndex2,int iFanin)

{
  ulong uVar1;
  uint *puVar2;
  uint uVar3;
  int iVar4;
  int iVar5;
  int iVar6;
  uint iFanin_00;
  int *piVar7;
  word *pwVar8;
  int *piVar9;
  long lVar10;
  undefined4 uVar11;
  ulong uVar12;
  byte bVar13;
  undefined4 uVar14;
  ulong uVar15;
  ulong uVar16;
  ulong uVar17;
  ulong uVar18;
  char *pcVar19;
  uint uVar20;
  ulong uVar21;
  word *pwVar22;
  ulong uVar23;
  ulong uVar24;
  ulong uVar25;
  ulong local_88;
  
  if (iObj < 1) {
LAB_0038143f:
    pcVar19 = "i>0";
LAB_0038148d:
    __assert_fail(pcVar19,
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acb.h"
                  ,0x10b,"word Acb_ObjTruth(Acb_Ntk_t *, int)");
  }
  uVar3 = (p->vObjTruth).nSize;
  if ((int)uVar3 < 1) {
    pcVar19 = "Acb_NtkHasObjTruths(p)";
    goto LAB_0038148d;
  }
  if (uVar3 <= (uint)iObj) {
LAB_00381448:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWrd.h"
                  ,0x18c,"word Vec_WrdEntry(Vec_Wrd_t *, int)");
  }
  if (iFanin < 1) goto LAB_0038143f;
  if (uVar3 <= (uint)iFanin) goto LAB_00381448;
  iVar4 = (p->vObjFans).nSize;
  if (iVar4 <= iObj) goto LAB_00381420;
  piVar7 = (p->vObjFans).pArray;
  iVar5 = piVar7[(uint)iObj];
  if (((long)iVar5 < 0) || (iVar6 = (p->vFanSto).nSize, iVar6 <= iVar5)) goto LAB_00381401;
  uVar12 = (ulong)(uint)iFaninIndex2;
  pwVar8 = (p->vObjTruth).pArray;
  local_88 = pwVar8[(uint)iFanin];
  piVar9 = (p->vFanSto).pArray;
  puVar2 = (uint *)(piVar9 + iVar5);
  uVar3 = *puVar2;
  uVar15 = 0;
  if (0 < (int)uVar3) {
    uVar15 = (ulong)uVar3;
  }
  uVar16 = 0xffffffffffffffff;
  do {
    if (uVar16 - uVar15 == -1) goto LAB_003813e2;
    uVar1 = uVar16 + 1;
    lVar10 = uVar16 + 2;
    uVar16 = uVar1;
  } while (puVar2[lVar10] != iFanin);
  if ((5 < uVar1) || (5 < (uint)iFaninIndex2)) {
LAB_003813e2:
    __assert_fail("iVar >= 0 && iVar < 6",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x240,"word Abc_Tt6Cofactor0(word, int)");
  }
  uVar23 = s_Truths6[uVar1] & pwVar8[(uint)iObj];
  bVar13 = (byte)(1 << ((byte)uVar1 & 0x1f));
  uVar21 = pwVar8[(uint)iObj] & s_Truths6Neg[uVar1];
  uVar23 = uVar23 >> (bVar13 & 0x3f) | uVar23;
  uVar21 = uVar21 << (bVar13 & 0x3f) | uVar21;
  uVar15 = s_Truths6Neg[uVar12];
  uVar18 = uVar21 & uVar15;
  bVar13 = (byte)(1 << ((byte)iFaninIndex2 & 0x1f));
  uVar18 = uVar18 << (bVar13 & 0x3f) | uVar18;
  uVar21 = uVar21 & s_Truths6[uVar12];
  uVar16 = s_Truths6[uVar12] & uVar23;
  uVar23 = uVar23 & uVar15;
  uVar21 = uVar21 >> (bVar13 & 0x3f) | uVar21;
  uVar23 = uVar23 << (bVar13 & 0x3f) | uVar23;
  uVar16 = uVar16 >> (bVar13 & 0x3f) | uVar16;
  if ((uVar18 == uVar21) && (uVar17 = uVar18, uVar24 = uVar16, uVar11 = 0, uVar18 == uVar23)) {
LAB_00381184:
    uVar14 = uVar11;
    uVar25 = (uVar24 ^ uVar17) & s_Truths6[uVar1] ^ uVar17;
  }
  else {
    if ((uVar16 == uVar18) && (uVar16 == uVar23)) {
      uVar17 = uVar23;
      uVar24 = uVar21;
      uVar11 = 1;
      goto LAB_00381184;
    }
    if (((uVar16 == uVar18) && (uVar17 = uVar21, uVar24 = uVar23, uVar11 = 2, uVar16 == uVar21)) ||
       ((uVar16 == uVar21 && (uVar17 = uVar23, uVar24 = uVar18, uVar11 = 3, uVar16 == uVar23))))
    goto LAB_00381184;
    uVar25 = 0;
    uVar14 = 0xffffffff;
    if ((uVar16 == uVar18) && (uVar17 = uVar18, uVar24 = uVar21, uVar11 = 4, uVar21 == uVar23))
    goto LAB_00381184;
  }
  if (iVar4 <= iFanin) goto LAB_00381420;
  iVar4 = piVar7[(uint)iFanin];
  if (((long)iVar4 < 0) || (iVar6 <= iVar4)) goto LAB_00381401;
  iFanin_00 = puVar2[uVar12 + 1];
  puVar2 = (uint *)(piVar9 + iVar4);
  uVar20 = *puVar2;
  uVar18 = 0;
  uVar16 = 0;
  if (0 < (int)uVar20) {
    uVar18 = (ulong)uVar20;
  }
  do {
    if (uVar18 == uVar16) goto LAB_00381200;
    uVar21 = uVar16 + 1;
    lVar10 = uVar16 + 1;
    uVar16 = uVar21;
  } while (puVar2[lVar10] != iFanin_00);
  uVar20 = (int)uVar21 - 1;
LAB_00381200:
  iVar4 = (p->vObjType).nSize;
  if (iVar4 <= iObj) {
LAB_00381467:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecStr.h"
                  ,0x164,"char Vec_StrEntry(Vec_Str_t *, int)");
  }
  pcVar19 = (p->vObjType).pArray;
  if (0xfd < (byte)(pcVar19[(uint)iObj] - 5U)) {
    __assert_fail("!Acb_ObjIsCio(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x69,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  if (iVar4 <= iFanin) goto LAB_00381467;
  if (0xfd < (byte)(pcVar19[(uint)iFanin] - 5U)) {
    __assert_fail("!Acb_ObjIsCio(p, iFanin)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x6a,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  if ((int)uVar3 <= (int)uVar1) {
    __assert_fail("iFaninIndex < Acb_ObjFaninNum(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x6b,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  if ((int)uVar3 <= iFaninIndex2) {
    __assert_fail("iFaninIndex2 < Acb_ObjFaninNum(p, iObj)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x6c,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  if (iFaninIndex2 == (int)uVar1) {
    __assert_fail("iFaninIndex != iFaninIndex2",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x6d,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  if ((p->vFanouts).nSize <= iFanin) {
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecWec.h"
                  ,0x9a,"Vec_Int_t *Vec_WecEntry(Vec_Wec_t *, int)");
  }
  if ((p->vFanouts).pArray[(uint)iFanin].nSize != 1) {
    __assert_fail("Acb_ObjFanoutNum(p, iFanin) == 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x6e,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  switch(uVar14) {
  case 0:
    goto LAB_003812f6;
  case 1:
    local_88 = ~local_88;
LAB_003812f6:
    local_88 = local_88 & s_Truths6[(int)uVar20];
    break;
  case 2:
    local_88 = local_88 & ~s_Truths6[(int)uVar20];
    break;
  case 3:
    local_88 = ~(local_88 | s_Truths6[(int)uVar20]);
    break;
  case 4:
    local_88 = local_88 ^ s_Truths6[(int)uVar20];
    break;
  default:
    __assert_fail("0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/base/acb/acbPush.c"
                  ,0x7a,"void Acb_ObjPushToFanin(Acb_Ntk_t *, int, int, int)");
  }
  if ((uVar15 & (uVar25 >> (bVar13 & 0x3f) ^ uVar25)) != 0) {
    __assert_fail("!Abc_Tt6HasVar(t, iVar)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/util/utilTruth.h"
                  ,0x5d4,"word Abc_Tt6RemoveVar(word, int)");
  }
  if (iFaninIndex2 != 5) {
    pwVar22 = s_PMasks[uVar12] + 2;
    do {
      uVar15 = uVar12 + 1;
      bVar13 = (byte)(1 << ((byte)uVar12 & 0x1f));
      uVar25 = (uVar25 & *pwVar22) >> (bVar13 & 0x3f) |
               (pwVar22[-1] & uVar25) << (bVar13 & 0x3f) |
               (*(word (*) [3])(pwVar22 + -2))[0] & uVar25;
      pwVar22 = pwVar22 + 3;
      uVar12 = uVar15;
    } while ((int)uVar15 != 5);
  }
  pwVar8[(uint)iObj] = uVar25;
  pwVar8[(uint)iFanin] = local_88;
  Acb_ObjRemoveFaninFanoutOne(p,iObj,iFanin_00);
  if (iFanin < (p->vObjFans).nSize) {
    iVar4 = (p->vObjFans).pArray[(uint)iFanin];
    if ((-1 < (long)iVar4) && (iVar4 < (p->vFanSto).nSize)) {
      if (uVar20 != (p->vFanSto).pArray[iVar4]) {
        return;
      }
      Acb_ObjAddFaninFanoutOne(p,iFanin,iFanin_00);
      return;
    }
LAB_00381401:
    __assert_fail("i >= 0 && i < p->nSize",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                  ,0x1b8,"int *Vec_IntEntryP(Vec_Int_t *, int)");
  }
LAB_00381420:
  __assert_fail("i >= 0 && i < p->nSize",
                "/workspace/llm4binary/github/license_all_cmakelists_25/zfchu[P]abc/src/misc/vec/vecInt.h"
                ,0x1a7,"int Vec_IntEntry(Vec_Int_t *, int)");
}

Assistant:

void Acb_ObjPushToFanin( Acb_Ntk_t * p, int iObj, int iFaninIndex2, int iFanin )
{
    word uTruthObjNew = 0, uTruthObj = Acb_ObjTruth( p, iObj );
    word uTruthFanNew = 0, uTruthFan = Acb_ObjTruth( p, iFanin );
    int iFaninIndex = Acb_ObjWhatFanin( p, iObj, iFanin );
    int DecType = Abc_TtCheckDsdAnd( uTruthObj, iFaninIndex, iFaninIndex2, &uTruthObjNew );
    int iFanin2 = Acb_ObjFanin( p, iObj, iFaninIndex2 );
    int iFaninFaninIndex = Acb_ObjWhatFanin( p, iFanin, iFanin2 );
    if ( iFaninFaninIndex == -1 )
        iFaninFaninIndex = Acb_ObjFaninNum(p, iFanin); 
    assert( !Acb_ObjIsCio(p, iObj) );
    assert( !Acb_ObjIsCio(p, iFanin) );
    assert( iFaninIndex  < Acb_ObjFaninNum(p, iObj) );
    assert( iFaninIndex2 < Acb_ObjFaninNum(p, iObj) );
    assert( iFaninIndex != iFaninIndex2 );
    assert( Acb_ObjFanoutNum(p, iFanin) == 1 );
    // compute new function of the fanout
    if ( DecType == 0 )      //  i *  j
        uTruthFanNew =  uTruthFan &  s_Truths6[iFaninFaninIndex];
    else if ( DecType == 1 ) //  i * !j
        uTruthFanNew = ~uTruthFan &  s_Truths6[iFaninFaninIndex];
    else if ( DecType == 2 ) // !i *  j
        uTruthFanNew =  uTruthFan & ~s_Truths6[iFaninFaninIndex];
    else if ( DecType == 3 ) // !i * !j
        uTruthFanNew = ~uTruthFan & ~s_Truths6[iFaninFaninIndex];
    else if ( DecType == 4 ) //  i #  j
        uTruthFanNew =  uTruthFan ^  s_Truths6[iFaninFaninIndex];
    else assert( 0 );
    // update functions
    Vec_WrdWriteEntry( &p->vObjTruth, iObj, Abc_Tt6RemoveVar(uTruthObjNew, iFaninIndex2) );
    Vec_WrdWriteEntry( &p->vObjTruth, iFanin, uTruthFanNew );
    // update fanins
    Acb_ObjRemoveFaninFanoutOne( p, iObj, iFanin2 );
    if ( iFaninFaninIndex == Acb_ObjFaninNum(p, iFanin) ) // adding new
        Acb_ObjAddFaninFanoutOne( p, iFanin, iFanin2 );
}